

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O3

string_view __thiscall bloaty::dwarf::ReadDebugStrEntry(dwarf *this,string_view section,size_t ofs)

{
  string_view sVar1;
  string_view local_10;
  
  local_10._M_str = section._M_str;
  local_10._M_len = (long)this - (long)local_10._M_str;
  if (local_10._M_str <= this) {
    local_10._M_str = (char *)((dwarf *)local_10._M_str + section._M_len);
    sVar1 = ReadUntilConsuming(&local_10,'\0');
    return sVar1;
  }
  Throw("premature EOF reading variable-length DWARF data",0xad);
}

Assistant:

std::string_view ReadDebugStrEntry(std::string_view section, size_t ofs) {
  SkipBytes(ofs, &section);
  return ReadNullTerminated(&section);
}